

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall presolve::HPresolve::removeFixedCol(HPresolve *this,HighsInt col)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int row;
  uint uVar4;
  HighsLp *pHVar5;
  pointer pdVar6;
  uint uVar7;
  double dVar8;
  
  bVar3 = (this->analysis_).logging_on_;
  if (bVar3 == true) {
    HPresolveAnalysis::startPresolveRuleLog(&this->analysis_,4);
  }
  dVar1 = (this->model->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  (this->changedColFlag).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[col] = '\x01';
  (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[col] = '\x01';
  this->numDeletedCols = this->numDeletedCols + 1;
  uVar7 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  while (uVar7 != 0xffffffff) {
    row = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[(int)uVar7];
    pHVar5 = this->model;
    uVar4 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar7];
    pdVar6 = (pHVar5->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar2 = pdVar6[row];
    dVar8 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar7] * dVar1;
    if (-INFINITY < dVar2) {
      pdVar6[row] = dVar2 - dVar8;
    }
    pdVar6 = (pHVar5->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar2 = pdVar6[row];
    if (dVar2 < INFINITY) {
      pdVar6[row] = dVar2 - dVar8;
    }
    unlink(this,(char *)(ulong)uVar7);
    reinsertEquation(this,row);
    uVar7 = uVar4;
  }
  pHVar5 = this->model;
  pdVar6 = (pHVar5->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar5->offset_ = dVar1 * pdVar6[col] + pHVar5->offset_;
  pdVar6[col] = 0.0;
  (this->analysis_).logging_on_ = bVar3;
  if (bVar3 == false) {
    return;
  }
  HPresolveAnalysis::stopPresolveRuleLog(&this->analysis_,4);
  return;
}

Assistant:

void HPresolve::removeFixedCol(HighsInt col) {
  const bool logging_on = analysis_.logging_on_;
  if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleFixedCol);
  double fixval = model->col_lower_[col];

  markColDeleted(col);

  for (HighsInt coliter = colhead[col]; coliter != -1;) {
    HighsInt colrow = Arow[coliter];
    double colval = Avalue[coliter];
    assert(Acol[coliter] == col);

    HighsInt colpos = coliter;
    coliter = Anext[coliter];

    if (model->row_lower_[colrow] != -kHighsInf)
      model->row_lower_[colrow] -= colval * fixval;

    if (model->row_upper_[colrow] != kHighsInf)
      model->row_upper_[colrow] -= colval * fixval;

    unlink(colpos);

    reinsertEquation(colrow);
  }

  model->offset_ += model->col_cost_[col] * fixval;
  assert(std::isfinite(model->offset_));
  model->col_cost_[col] = 0;
  analysis_.logging_on_ = logging_on;
  if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleFixedCol);
}